

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateProtoHeader
          (FileGenerator *this,Printer *printer,string *info_path)

{
  FileDescriptor *pFVar1;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  string dependency;
  string filename_identifier;
  string local_98;
  string *local_78;
  string local_70;
  string local_50;
  
  if ((this->options_).proto_h == true) {
    local_78 = info_path;
    FilenameIdentifier(&local_50,*(string **)this->file_);
    io::Printer::Print(printer,
                       "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#ifndef PROTOBUF_$filename_identifier$__INCLUDED\n#define PROTOBUF_$filename_identifier$__INCLUDED\n\n#include <string>\n"
                       ,"filename",*(string **)this->file_,"filename_identifier",&local_50);
    io::Printer::Print(printer,"\n");
    GenerateLibraryIncludes(this,printer);
    pFVar1 = this->file_;
    if (0 < *(int *)(pFVar1 + 0x38)) {
      lVar4 = 0;
      do {
        pFVar1 = FileDescriptor::dependency(pFVar1,*(int *)(*(long *)(pFVar1 + 0x40) + lVar4 * 4));
        StripProto(&local_70,*(string **)pFVar1);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
        psVar3 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar3) {
          local_98.field_2._M_allocated_capacity = *psVar3;
          local_98.field_2._8_8_ = plVar2[3];
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar3;
          local_98._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_98._M_string_length = plVar2[1];
        *plVar2 = (long)psVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        io::Printer::Print(printer,"#include \"$dependency$\"  // IWYU pragma: export\n",
                           "dependency",&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        lVar4 = lVar4 + 1;
        pFVar1 = this->file_;
      } while (lVar4 < *(int *)(pFVar1 + 0x38));
    }
    GenerateMetadataPragma(this,printer,local_78);
    GenerateHeader(this,printer);
    io::Printer::Print(printer,"#endif  // PROTOBUF_$filename_identifier$__INCLUDED\n",
                       "filename_identifier",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateProtoHeader(io::Printer* printer,
                                        const string& info_path) {
  if (!options_.proto_h) {
    return;
  }

  string filename_identifier = FilenameIdentifier(file_->name());
  GenerateTopHeaderGuard(printer, filename_identifier);


  GenerateLibraryIncludes(printer);

  for (int i = 0; i < file_->public_dependency_count(); i++) {
    const FileDescriptor* dep = file_->public_dependency(i);
    const char* extension = ".proto.h";
    string dependency = StripProto(dep->name()) + extension;
    printer->Print(
      "#include \"$dependency$\"  // IWYU pragma: export\n",
      "dependency", dependency);
  }

  GenerateMetadataPragma(printer, info_path);

  GenerateHeader(printer);

  GenerateBottomHeaderGuard(printer, filename_identifier);
}